

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O3

void __thiscall cmDebugServer::ProcessBroadcastQueue(cmDebugServer *this)

{
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  pointer __pos;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->BroadcastQueueMutex);
  if (iVar2 == 0) {
    __pos = (this->BroadcastQueue).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->BroadcastQueue).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__pos != pbVar1) {
      do {
        (*(this->super_cmServerBase)._vptr_cmServerBase[10])(this,__pos);
        __pos = __pos + 1;
      } while (__pos != pbVar1);
      __pos = (this->BroadcastQueue).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->BroadcastQueue,__pos);
    pthread_mutex_unlock((pthread_mutex_t *)&this->BroadcastQueueMutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void cmDebugServer::ProcessBroadcastQueue()
{
  std::lock_guard<std::mutex> l(BroadcastQueueMutex);
  for (auto& msg : BroadcastQueue) {
    this->Broadcast(msg);
  }
  this->BroadcastQueue.clear();
}